

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_ldrddi.cpp
# Opt level: O0

ze_result_t loader::zesFrequencyOcSetTjMax(zes_freq_handle_t hFrequency,double ocTjMax)

{
  zes_pfnFrequencyOcSetTjMax_t pfnOcSetTjMax;
  dditable_t *dditable;
  ze_result_t result;
  double ocTjMax_local;
  zes_freq_handle_t hFrequency_local;
  
  if (*(code **)(*(long *)(hFrequency + 8) + 0xb58) == (code *)0x0) {
    hFrequency_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else {
    hFrequency_local._4_4_ =
         (**(code **)(*(long *)(hFrequency + 8) + 0xb58))(ocTjMax,*(undefined8 *)hFrequency);
  }
  return hFrequency_local._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesFrequencyOcSetTjMax(
        zes_freq_handle_t hFrequency,                   ///< [in] Handle for the component.
        double ocTjMax                                  ///< [in] The new maximum temperature limit in degrees Celsius.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<zes_freq_object_t*>( hFrequency )->dditable;
        auto pfnOcSetTjMax = dditable->zes.Frequency.pfnOcSetTjMax;
        if( nullptr == pfnOcSetTjMax )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // convert loader handle to driver handle
        hFrequency = reinterpret_cast<zes_freq_object_t*>( hFrequency )->handle;

        // forward to device-driver
        result = pfnOcSetTjMax( hFrequency, ocTjMax );

        return result;
    }